

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_config(lysc_ctx *ctx,lysc_node *node)

{
  lysc_node *node_local;
  lysc_ctx *ctx_local;
  
  if ((node->nodetype == 0x80) && ((node->flags & 3) != 0)) {
    __assert_fail("(node->nodetype != LYS_CASE) || !(node->flags & LYS_CONFIG_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0xa41,"LY_ERR lys_compile_config(struct lysc_ctx *, struct lysc_node *)");
  }
  if ((ctx->compile_opts & 4) == 0) {
    if ((node->flags & 3) == 0) {
      if (((node->parent != (lysc_node *)0x0) && ((node->parent->flags & 3) == 0)) &&
         ((node->parent->nodetype & 0x8000) == 0)) {
        __assert_fail("!node->parent || (node->parent->flags & LYS_CONFIG_MASK) || (node->parent->nodetype & LYS_AUGMENT)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0xa48,"LY_ERR lys_compile_config(struct lysc_ctx *, struct lysc_node *)");
      }
      if ((node->parent == (lysc_node *)0x0) || ((node->parent->flags & 3) == 0)) {
        node->flags = node->flags | 1;
      }
      else {
        node->flags = node->flags | node->parent->flags & 3;
      }
    }
    else {
      node->flags = node->flags | 0x800;
    }
  }
  else {
    node->flags = node->flags & 0xfffc;
  }
  if (((node->parent == (lysc_node *)0x0) || ((node->parent->flags & 2) == 0)) ||
     ((node->flags & 1) == 0)) {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  else {
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
            "Configuration node cannot be child of any state data node.");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_compile_config(struct lysc_ctx *ctx, struct lysc_node *node)
{
    /* case never has any explicit config */
    assert((node->nodetype != LYS_CASE) || !(node->flags & LYS_CONFIG_MASK));

    if (ctx->compile_opts & LYS_COMPILE_NO_CONFIG) {
        /* ignore config statements inside Notification/RPC/action/... data */
        node->flags &= ~LYS_CONFIG_MASK;
    } else if (!(node->flags & LYS_CONFIG_MASK)) {
        /* config not explicitly set, inherit it from parent */
        assert(!node->parent || (node->parent->flags & LYS_CONFIG_MASK) || (node->parent->nodetype & LYS_AUGMENT));
        if (node->parent && (node->parent->flags & LYS_CONFIG_MASK)) {
            node->flags |= node->parent->flags & LYS_CONFIG_MASK;
        } else {
            /* default is config true */
            node->flags |= LYS_CONFIG_W;
        }
    } else {
        /* config set explicitly */
        node->flags |= LYS_SET_CONFIG;
    }

    if (node->parent && (node->parent->flags & LYS_CONFIG_R) && (node->flags & LYS_CONFIG_W)) {
        LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Configuration node cannot be child of any state data node.");
        return LY_EVALID;
    }

    return LY_SUCCESS;
}